

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall flatbuffers::cpp::CppGenerator::GenEnumArray(CppGenerator *this,EnumDef *enum_def)

{
  CodeWriter *this_00;
  EnumVal *pEVar1;
  EnumVal *pEVar2;
  char *__rhs;
  pointer ppEVar3;
  string value;
  string num_fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  NumToString<unsigned_long>
            (&local_90,
             (long)(enum_def->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(enum_def->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_170,"inline const {{ENUM_NAME}} (&EnumValues{{ENUM_NAME}}())[",&local_90);
  std::operator+(&local_b0,&local_170,"] {");
  this_00 = &this->code_;
  CodeWriter::operator+=(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"  static const {{ENUM_NAME}} values[] = {",
             (allocator<char> *)&local_170);
  CodeWriter::operator+=(this_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  for (ppEVar3 = (enum_def->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar3 !=
      (enum_def->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar3 = ppEVar3 + 1) {
    GetEnumValUse_abi_cxx11_(&local_170,this,enum_def,*ppEVar3);
    pEVar1 = *ppEVar3;
    pEVar2 = (enum_def->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1];
    std::operator+(&local_70,"    ",&local_170);
    __rhs = ",";
    if (pEVar1 == pEVar2) {
      __rhs = "";
    }
    std::operator+(&local_50,&local_70,__rhs);
    CodeWriter::operator+=(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_170);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"  };",(allocator<char> *)&local_170);
  CodeWriter::operator+=(this_00,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"  return values;",(allocator<char> *)&local_170);
  CodeWriter::operator+=(this_00,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"}",(allocator<char> *)&local_170);
  CodeWriter::operator+=(this_00,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"",(allocator<char> *)&local_170);
  CodeWriter::operator+=(this_00,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void GenEnumArray(const EnumDef &enum_def) {
    auto num_fields = NumToString(enum_def.size());
    code_ += "inline const {{ENUM_NAME}} (&EnumValues{{ENUM_NAME}}())[" +
             num_fields + "] {";
    code_ += "  static const {{ENUM_NAME}} values[] = {";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      const auto &ev = **it;
      auto value = GetEnumValUse(enum_def, ev);
      auto suffix = *it != enum_def.Vals().back() ? "," : "";
      code_ += "    " + value + suffix;
    }
    code_ += "  };";
    code_ += "  return values;";
    code_ += "}";
    code_ += "";
  }